

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  Wlc_Obj_t *pWVar1;
  int *piVar2;
  ushort uVar3;
  uint uVar4;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *paVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  
  if ((iObj < 1) || (p->nObjsAlloc <= iObj)) {
    __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                  ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
  }
  pWVar1 = p->pObjs + (uint)iObj;
  vFanins->nSize = 0;
  uVar6 = (ulong)pWVar1->nFanins;
  if (0 < (int)pWVar1->nFanins) {
    lVar9 = 0;
    do {
      if ((2 < (uint)uVar6) ||
         (paVar5 = &pWVar1->field_8,
         (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x3f) ==
         (undefined1  [24])0x6)) {
        paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *)(pWVar1->field_8).pFanins[0];
      }
      iVar8 = paVar5->Fanins[lVar9];
      if (((long)iVar8 < 0) || ((p->vCopies).nSize <= iVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(vFanins,(p->vCopies).pArray[iVar8]);
      lVar9 = lVar9 + 1;
      uVar6 = (ulong)(int)pWVar1->nFanins;
    } while (lVar9 < (long)uVar6);
  }
  uVar3 = *(ushort *)pWVar1 & 0x3f;
  if ((uVar3 != 0x2c) && (uVar3 != 0x13)) {
    if ((uVar3 == 6) &&
       (uVar7 = (pWVar1->End - pWVar1->Beg) + 1, iVar8 = (int)uVar7 >> 5,
       uVar4 = (uint)((uVar7 & 0x1f) != 0), uVar7 = uVar4 + iVar8,
       uVar7 != 0 && SCARRY4(uVar4,iVar8) == (int)uVar7 < 0)) {
      piVar2 = (pWVar1->field_8).pFanins[0];
      uVar6 = 0;
      do {
        Vec_IntPush(vFanins,piVar2[uVar6]);
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    return;
  }
  if (vFanins->nSize == 1) {
    Vec_IntPush(vFanins,(pWVar1->field_8).Fanins[1]);
    return;
  }
  __assert_fail("Vec_IntSize(vFanins) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcNtk.c"
                ,0x20d,"void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *, int, Vec_Int_t *)");
}

Assistant:

void Wlc_ObjCollectCopyFanins( Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, iObj );
    Vec_IntClear( vFanins );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Vec_IntPush( vFanins, Wlc_ObjCopy(p, iFanin) );
    // special treatment of CONST and SELECT
    if ( pObj->Type == WLC_OBJ_CONST )
    {
        int * pInts = Wlc_ObjConstValue( pObj );
        int nInts = Abc_BitWordNum( Wlc_ObjRange(pObj) );
        for ( i = 0; i < nInts; i++ )
            Vec_IntPush( vFanins, pInts[i] );
    }
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT || pObj->Type == WLC_OBJ_TABLE )
    {
        assert( Vec_IntSize(vFanins) == 1 );
        Vec_IntPush( vFanins, pObj->Fanins[1] );
    }
}